

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::init<Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
           *this,SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  long *plVar1;
  Stack<Lib::BacktrackData_*> *this_00;
  BacktrackData **ppBVar2;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> local_48;
  Node *local_38;
  
  *(AbstractingUnifier **)this = args;
  (args->_uwa)._mode = args_1._mode;
  this[8] = (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
             )args_2;
  this[0x30] = (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
                )retrieveSubstitution;
  local_48._isSome = false;
  local_48._1_7_ = 0;
  local_48._elem._elem = (Value)0x0;
  Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::operator=
            ((OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_> *)
             (this + 0x38),&local_48);
  if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
    plVar1 = (long *)((long)local_48._elem._elem + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_48._elem._elem + 8))();
    }
  }
  this[0x90] = (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
                )0x0;
  if (root != (Node *)0x0) {
    this_00 = (Stack<Lib::BacktrackData_*> *)**(undefined8 **)this;
    ppBVar2 = this_00->_cursor;
    local_38 = root;
    if (ppBVar2 == this_00->_end) {
      Lib::Stack<Lib::BacktrackData_*>::expand(this_00);
      ppBVar2 = this_00->_cursor;
    }
    *ppBVar2 = (BacktrackData *)(this + 0x68);
    this_00->_cursor = this_00->_cursor + 1;
    createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::init<Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
              (parent,query,reversed,(anon_class_8_1_8991fb9c)this);
    *(long *)(**(long **)this + 0x10) = *(long *)(**(long **)this + 0x10) + -8;
    Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
    ::prepareChildren((Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                       *)this,local_38,false);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }